

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVectorUtil.hpp
# Opt level: O2

Vector<double,_4> * __thiscall
tcu::refract<double,4>
          (Vector<double,_4> *__return_storage_ptr__,tcu *this,Vector<double,_4> *i,
          Vector<double,_4> *n,double eta)

{
  double dVar1;
  double dVar2;
  Vector<double,_4> local_58;
  Vector<double,_4> local_38;
  
  dVar1 = dot<double,4>(i,(Vector<double,_4> *)this);
  dVar2 = 1.0 - eta * eta * (1.0 - dVar1 * dVar1);
  if (0.0 <= dVar2) {
    operator*(&local_58,eta,(Vector<double,_4> *)this);
    if (dVar2 < 0.0) {
      dVar2 = ::sqrt(dVar2);
    }
    else {
      dVar2 = SQRT(dVar2);
    }
    operator*(&local_38,eta * dVar1 + dVar2,i);
    operator-(__return_storage_ptr__,&local_58,&local_38);
  }
  else {
    Vector<double,_4>::Vector(__return_storage_ptr__,0.0);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Vector<T, Size> refract (const Vector<T, Size>& i, const Vector<T, Size>& n, T eta)
{
	T cosAngle = dot(n, i);
	T k = T(1) - eta * eta * (T(1) - cosAngle * cosAngle);
	if (k < T(0))
		return Vector<T, Size>(T(0));
	else
		return i * eta - n * T(eta * cosAngle + ::sqrt(k));
}